

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONHandler.cc
# Opt level: O0

void __thiscall JSONHandler::JSONHandler(JSONHandler *this)

{
  Members *this_00;
  JSONHandler *this_local;
  
  this_00 = (Members *)operator_new(0x180);
  memset(this_00,0,0x180);
  Members::Members(this_00);
  std::unique_ptr<JSONHandler::Members,std::default_delete<JSONHandler::Members>>::
  unique_ptr<std::default_delete<JSONHandler::Members>,void>
            ((unique_ptr<JSONHandler::Members,std::default_delete<JSONHandler::Members>> *)this,
             this_00);
  return;
}

Assistant:

JSONHandler::JSONHandler() :
    m(new Members())
{
}